

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UDateTimePatternField __thiscall
icu_63::DateTimePatternGenerator::getFieldAndWidthIndices
          (DateTimePatternGenerator *this,char *key,UDateTimePGDisplayWidth *widthP)

{
  int iVar1;
  char *__s2;
  UDateTimePatternField local_58;
  UDateTimePGDisplayWidth local_54;
  int32_t i_1;
  int32_t i;
  char *hyphenPtr;
  char cldrFieldKey [25];
  UDateTimePGDisplayWidth *widthP_local;
  char *key_local;
  DateTimePatternGenerator *this_local;
  
  unique0x10000098 = widthP;
  strncpy((char *)&hyphenPtr,key,0x18);
  cldrFieldKey[0x10] = '\0';
  *stack0xffffffffffffffd8 = UDATPG_WIDE;
  __s2 = strchr((char *)&hyphenPtr,0x2d);
  if (__s2 != (char *)0x0) {
    for (local_54 = UDATPG_NARROW; 0 < (int)local_54; local_54 = local_54 - UDATPG_ABBREVIATED) {
      iVar1 = strcmp(*(char **)(CLDR_FIELD_WIDTH + (long)(int)local_54 * 8),__s2);
      if (iVar1 == 0) {
        *stack0xffffffffffffffd8 = local_54;
        break;
      }
    }
    *__s2 = '\0';
  }
  local_58 = UDATPG_ERA_FIELD;
  while( true ) {
    if (0xf < (int)local_58) {
      return UDATPG_FIELD_COUNT;
    }
    iVar1 = strcmp(*(char **)(CLDR_FIELD_NAME + (long)(int)local_58 * 8),(char *)&hyphenPtr);
    if (iVar1 == 0) break;
    local_58 = local_58 + UDATPG_YEAR_FIELD;
  }
  return local_58;
}

Assistant:

UDateTimePatternField
DateTimePatternGenerator::getFieldAndWidthIndices(const char* key, UDateTimePGDisplayWidth* widthP) const {
    char cldrFieldKey[UDATPG_FIELD_KEY_MAX + 1];
    uprv_strncpy(cldrFieldKey, key, UDATPG_FIELD_KEY_MAX);
    cldrFieldKey[UDATPG_FIELD_KEY_MAX]=0; // ensure termination
    *widthP = UDATPG_WIDE;
    char* hyphenPtr = uprv_strchr(cldrFieldKey, '-');
    if (hyphenPtr) {
        for (int32_t i=UDATPG_WIDTH_COUNT-1; i>0; --i) {
            if (uprv_strcmp(CLDR_FIELD_WIDTH[i], hyphenPtr)==0) {
                *widthP=(UDateTimePGDisplayWidth)i;
                break;
            }
        }
        *hyphenPtr = 0; // now delete width portion of key
    }
    for (int32_t i=0; i<UDATPG_FIELD_COUNT; ++i ) {
        if (uprv_strcmp(CLDR_FIELD_NAME[i],cldrFieldKey)==0) {
            return (UDateTimePatternField)i;
        }
    }
    return UDATPG_FIELD_COUNT;
}